

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWindowsRegistry.cxx
# Opt level: O0

string_view cmWindowsRegistry::FromView(View view)

{
  allocator<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this;
  initializer_list<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  __l;
  string_view sVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  static_string_view sVar5;
  size_t local_1b0;
  char *local_1a8;
  _Node_iterator_base<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
  local_1a0;
  _Node_iterator_base<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
  local_198;
  iterator it;
  string_view local_188;
  View local_174;
  string_view local_170;
  View local_15c;
  string_view local_158;
  View local_144;
  string_view local_140;
  View local_12c;
  string_view local_128;
  View local_114;
  string_view local_110;
  View local_100 [4];
  string_view local_f0;
  View local_dc;
  pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_d8;
  pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_c0;
  pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a8;
  pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_90;
  pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_78;
  pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_60;
  pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  iterator local_30;
  size_type local_28;
  View local_1c;
  size_t sStack_18;
  View view_local;
  char *local_10;
  
  local_1c = view;
  if (FromView(cmWindowsRegistry::View)::ViewDefinitions == '\0') {
    iVar3 = __cxa_guard_acquire(&FromView(cmWindowsRegistry::View)::ViewDefinitions);
    if (iVar3 != 0) {
      local_dc = Both;
      local_f0 = (string_view)::cm::operator____s("BOTH",4);
      std::
      pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>::
      pair<cmWindowsRegistry::View,_cm::static_string_view,_true>
                (&local_d8,&local_dc,(static_string_view *)&local_f0);
      local_100[0] = Host;
      local_110 = (string_view)::cm::operator____s("HOST",4);
      std::
      pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>::
      pair<cmWindowsRegistry::View,_cm::static_string_view,_true>
                (&local_c0,local_100,(static_string_view *)&local_110);
      local_114 = Target;
      local_128 = (string_view)::cm::operator____s("TARGET",6);
      std::
      pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>::
      pair<cmWindowsRegistry::View,_cm::static_string_view,_true>
                (&local_a8,&local_114,(static_string_view *)&local_128);
      local_12c = Reg32;
      local_140 = (string_view)::cm::operator____s("32",2);
      std::
      pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>::
      pair<cmWindowsRegistry::View,_cm::static_string_view,_true>
                (&local_90,&local_12c,(static_string_view *)&local_140);
      local_144 = Reg64;
      local_158 = (string_view)::cm::operator____s("64",2);
      std::
      pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>::
      pair<cmWindowsRegistry::View,_cm::static_string_view,_true>
                (&local_78,&local_144,(static_string_view *)&local_158);
      local_15c = Reg32_64;
      local_170 = (string_view)::cm::operator____s("32_64",5);
      std::
      pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>::
      pair<cmWindowsRegistry::View,_cm::static_string_view,_true>
                (&local_60,&local_15c,(static_string_view *)&local_170);
      local_174 = Reg64_32;
      local_188 = (string_view)::cm::operator____s("64_32",5);
      std::
      pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>::
      pair<cmWindowsRegistry::View,_cm::static_string_view,_true>
                (&local_48,&local_174,(static_string_view *)&local_188);
      local_30 = &local_d8;
      local_28 = 7;
      this = (allocator<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)((long)&it.
                        super__Node_iterator_base<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
                        ._M_cur + 5);
      std::
      allocator<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::allocator(this);
      __l._M_len = local_28;
      __l._M_array = local_30;
      std::
      unordered_map<cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<cmWindowsRegistry::View>,_std::equal_to<cmWindowsRegistry::View>,_std::allocator<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::unordered_map(&FromView::ViewDefinitions,__l,0,
                      (hasher *)
                      ((long)&it.
                              super__Node_iterator_base<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
                              ._M_cur + 7),
                      (key_equal *)
                      ((long)&it.
                              super__Node_iterator_base<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
                              ._M_cur + 6),this);
      std::
      allocator<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~allocator((allocator<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)((long)&it.
                              super__Node_iterator_base<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
                              ._M_cur + 5));
      __cxa_atexit(std::
                   unordered_map<cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<cmWindowsRegistry::View>,_std::equal_to<cmWindowsRegistry::View>,_std::allocator<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   ::~unordered_map,&FromView::ViewDefinitions,&__dso_handle);
      __cxa_guard_release(&FromView(cmWindowsRegistry::View)::ViewDefinitions);
    }
  }
  local_198._M_cur =
       (__node_type *)
       std::
       unordered_map<cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<cmWindowsRegistry::View>,_std::equal_to<cmWindowsRegistry::View>,_std::allocator<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
       ::find(&FromView::ViewDefinitions,&local_1c);
  local_1a0._M_cur =
       (__node_type *)
       std::
       unordered_map<cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<cmWindowsRegistry::View>,_std::equal_to<cmWindowsRegistry::View>,_std::allocator<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
       ::end(&FromView::ViewDefinitions);
  bVar2 = std::__detail::operator==(&local_198,&local_1a0);
  if (bVar2) {
    sVar5 = ::cm::operator____s("",0);
    local_1b0 = sVar5.super_string_view._M_len;
    sStack_18 = local_1b0;
    local_1a8 = sVar5.super_string_view._M_str;
    local_10 = local_1a8;
  }
  else {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_false>
                           *)&local_198);
    sStack_18 = (ppVar4->second)._M_len;
    local_10 = (ppVar4->second)._M_str;
  }
  sVar1._M_str = local_10;
  sVar1._M_len = sStack_18;
  return sVar1;
}

Assistant:

cm::string_view cmWindowsRegistry::FromView(View view)
{
  static std::unordered_map<cmWindowsRegistry::View, cm::string_view>
    ViewDefinitions{
      { View::Both, "BOTH"_s },     { View::Host, "HOST"_s },
      { View::Target, "TARGET"_s }, { View::Reg32, "32"_s },
      { View::Reg64, "64"_s },      { View::Reg32_64, "32_64"_s },
      { View::Reg64_32, "64_32"_s }
    };

  auto it = ViewDefinitions.find(view);

  return it == ViewDefinitions.end() ? ""_s : it->second;
}